

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)> * __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::range<0ul,char_const(&)[4],char_const(&)[4]>
          (TableIterable<kj::TreeMap<kj::String,_int>::Entry,_decltype(inner)>
           *__return_storage_ptr__,
          Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
          *this,char (*begin) [4],char (*end) [4])

{
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table_00;
  IterRange<kj::_::BTreeImpl::Iterator> inner;
  Iterator local_80 [2];
  Iterator local_50;
  
  table.size_ = *(long *)(this + 8) - (long)*(StringPtr **)this >> 5;
  table.ptr = *(StringPtr **)this;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  seek<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4]>
            (local_80,(TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)(this + 0x20),table,begin
            );
  table_00.size_ = *(long *)(this + 8) - (long)*(StringPtr **)this >> 5;
  table_00.ptr = *(StringPtr **)this;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  seek<kj::TreeMap<kj::String,int>::Entry,char_const(&)[4]>
            (&local_50,(TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)(this + 0x20),table_00,
             end);
  (__return_storage_ptr__->inner).e.leaf = local_50.leaf;
  (__return_storage_ptr__->inner).e.row = local_50.row;
  *(undefined4 *)&(__return_storage_ptr__->inner).e.field_0x14 = local_50._20_4_;
  (__return_storage_ptr__->inner).b.tree = local_80[0].tree;
  (__return_storage_ptr__->inner).b.leaf = local_80[0].leaf;
  (__return_storage_ptr__->inner).b.row = local_80[0].row;
  *(undefined4 *)&(__return_storage_ptr__->inner).b.field_0x14 = local_80[0]._20_4_;
  (__return_storage_ptr__->inner).e.tree = local_50.tree;
  (__return_storage_ptr__->super_TableMapping<kj::TreeMap<kj::String,_int>::Entry>).table =
       *(StringPtr **)this;
  return __return_storage_ptr__;
}

Assistant:

auto Table<Row, Indexes...>::range(BeginKey&& begin, EndKey&& end) {
  auto inner = _::iterRange(get<index>(indexes).seek(rows.asPtr(), kj::fwd<BeginKey>(begin)),
                            get<index>(indexes).seek(rows.asPtr(), kj::fwd<EndKey>(end)));
  return _::TableIterable<Row, decltype(inner)>(kj::mv(inner), rows.begin());
}